

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::analysis::DebugInfoManager::GetDebugOperationWithDeref(DebugInfoManager *this)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<spvtools::opt::Operand> __l;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> init_list_03;
  initializer_list<unsigned_int> init_list_04;
  initializer_list<spvtools::opt::Operand> __l_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  IRContext *pIVar4;
  FeatureManager *this_00;
  Instruction *pIVar5;
  IRContext *pIVar6;
  TypeManager *pTVar7;
  ConstantManager *this_01;
  DefUseManager *this_02;
  Operand *local_388;
  Operand *local_348;
  undefined1 local_338 [12];
  uint32_t local_32c;
  iterator local_328;
  IRContext *local_320;
  SmallVector<unsigned_int,_2UL> local_318;
  uint local_2ec;
  iterator local_2e8;
  undefined8 local_2e0;
  SmallVector<unsigned_int,_2UL> local_2d8;
  uint32_t local_2ac;
  DebugScope local_2a8;
  _func_int **local_2a0;
  SmallVector<unsigned_int,_2UL> local_298;
  Operand local_270;
  Operand OStack_240;
  Operand OStack_210;
  iterator local_1e0;
  pointer local_1d8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_1d0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1b8
  ;
  uint32_t local_1ac;
  allocator<spvtools::opt::Operand> local_1a5;
  uint32_t deref_id;
  _func_int **local_1a0;
  _func_int **local_198;
  SmallVector<unsigned_int,_2UL> local_190;
  undefined1 local_164 [12];
  pointer local_158;
  SmallVector<unsigned_int,_2UL> local_150;
  uint32_t local_124;
  _func_int **local_120;
  Instruction *local_118;
  SmallVector<unsigned_int,_2UL> local_110;
  undefined1 local_e8 [96];
  Operand OStack_88;
  pointer local_58;
  pointer local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_30;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  deref_operation;
  uint32_t result_id;
  DebugInfoManager *this_local;
  
  if (this->deref_operation_ == (Instruction *)0x0) {
    pIVar4 = context(this);
    deref_operation._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
         IRContext::TakeNextId(pIVar4);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_28);
    pIVar4 = context(this);
    this_00 = IRContext::get_feature_mgr(pIVar4);
    uVar2 = FeatureManager::GetExtInstImportId_OpenCL100DebugInfo(this_00);
    if (uVar2 == 0) {
      pIVar4 = context(this);
      this_01 = IRContext::get_constant_mgr(pIVar4);
      local_1ac = ConstantManager::GetUIntConstId(this_01,0);
      pIVar5 = (Instruction *)::operator_new(0x70);
      pIVar4 = context(this);
      pIVar6 = context(this);
      pTVar7 = IRContext::get_type_mgr(pIVar6);
      uVar3 = TypeManager::GetVoidTypeId(pTVar7);
      uVar2 = deref_operation._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
      local_2ac = GetDbgSetImportId(this);
      local_2a8 = (DebugScope)&local_2ac;
      local_2a0 = (_func_int **)0x1;
      init_list_01._M_len = 1;
      init_list_01._M_array = (iterator)local_2a8;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_298,init_list_01);
      Operand::Operand(&local_270,SPV_OPERAND_TYPE_ID,&local_298);
      local_2ec = 0x1e;
      local_2e8 = &local_2ec;
      local_2e0._0_4_ = 1;
      local_2e0._4_4_ = 0;
      init_list_00._M_len = 1;
      init_list_00._M_array = local_2e8;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2d8,init_list_00);
      Operand::Operand(&OStack_240,SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,&local_2d8);
      local_32c = local_1ac;
      local_328 = &local_32c;
      local_320 = (IRContext *)0x1;
      init_list._M_len = 1;
      init_list._M_array = local_328;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_318,init_list);
      Operand::Operand(&OStack_210,SPV_OPERAND_TYPE_ID,&local_318);
      local_1e0 = &local_270;
      local_1d8 = (pointer)0x3;
      std::allocator<spvtools::opt::Operand>::allocator
                ((allocator<spvtools::opt::Operand> *)(local_338 + 0xb));
      __l._M_len = (size_type)local_1d8;
      __l._M_array = local_1e0;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_1d0,__l,(allocator_type *)(local_338 + 0xb));
      opt::Instruction::Instruction(pIVar5,pIVar4,OpExtInst,uVar3,uVar2,&local_1d0);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_1b8,pIVar5);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::operator=(&local_28,&local_1b8);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_1b8);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_1d0);
      std::allocator<spvtools::opt::Operand>::~allocator
                ((allocator<spvtools::opt::Operand> *)(local_338 + 0xb));
      local_388 = (Operand *)&local_1e0;
      do {
        local_388 = local_388 + -1;
        Operand::~Operand(local_388);
      } while (local_388 != &local_270);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_318);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_2d8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_298);
    }
    else {
      pIVar5 = (Instruction *)::operator_new(0x70);
      pIVar4 = context(this);
      pIVar6 = context(this);
      pTVar7 = IRContext::get_type_mgr(pIVar6);
      uVar3 = TypeManager::GetVoidTypeId(pTVar7);
      uVar2 = deref_operation._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
      local_124 = GetDbgSetImportId(this);
      local_120 = (_func_int **)&local_124;
      local_118 = (Instruction *)0x1;
      init_list_04._M_len = 1;
      init_list_04._M_array = (iterator)local_120;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_110,init_list_04);
      Operand::Operand((Operand *)local_e8,SPV_OPERAND_TYPE_ID,&local_110);
      local_164._0_4_ = 0x1e;
      local_164._4_8_ = local_164;
      local_158 = (pointer)0x1;
      init_list_03._M_len = 1;
      init_list_03._M_array = (iterator)local_164._4_8_;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list_03);
      Operand::Operand((Operand *)(local_e8 + 0x30),SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
                       &local_150);
      deref_id = 0;
      local_1a0 = (_func_int **)&deref_id;
      local_198 = (_func_int **)0x1;
      init_list_02._M_len = 1;
      init_list_02._M_array = (iterator)local_1a0;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_190,init_list_02);
      Operand::Operand(&OStack_88,SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION,&local_190);
      local_58 = (pointer)local_e8;
      local_50 = (pointer)0x3;
      std::allocator<spvtools::opt::Operand>::allocator(&local_1a5);
      __l_00._M_len = (size_type)local_50;
      __l_00._M_array = (iterator)local_58;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_48,__l_00,&local_1a5);
      opt::Instruction::Instruction(pIVar5,pIVar4,OpExtInst,uVar3,uVar2,&local_48);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_30,pIVar5);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::operator=(&local_28,&local_30);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_30);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_48);
      std::allocator<spvtools::opt::Operand>::~allocator(&local_1a5);
      local_348 = (Operand *)&local_58;
      do {
        local_348 = local_348 + -1;
        Operand::~Operand(local_348);
      } while (local_348 != (Operand *)local_e8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_190);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_110);
    }
    pIVar4 = context(this);
    IRContext::module(pIVar4);
    Module::ext_inst_debuginfo_begin((Module *)local_338);
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)local_338);
    pIVar5 = opt::Instruction::InsertBefore(pIVar5,&local_28);
    this->deref_operation_ = pIVar5;
    RegisterDbgInst(this,this->deref_operation_);
    pIVar4 = context(this);
    bVar1 = IRContext::AreAnalysesValid(pIVar4,kAnalysisBegin);
    if (bVar1) {
      pIVar4 = context(this);
      this_02 = IRContext::get_def_use_mgr(pIVar4);
      DefUseManager::AnalyzeInstDefUse(this_02,this->deref_operation_);
    }
    this_local = (DebugInfoManager *)this->deref_operation_;
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_28);
  }
  else {
    this_local = (DebugInfoManager *)this->deref_operation_;
  }
  return (Instruction *)this_local;
}

Assistant:

Instruction* DebugInfoManager::GetDebugOperationWithDeref() {
  if (deref_operation_ != nullptr) return deref_operation_;

  uint32_t result_id = context()->TakeNextId();
  std::unique_ptr<Instruction> deref_operation;

  if (context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo()) {
    deref_operation = std::unique_ptr<Instruction>(new Instruction(
        context(), spv::Op::OpExtInst,
        context()->get_type_mgr()->GetVoidTypeId(), result_id,
        {
            {SPV_OPERAND_TYPE_ID, {GetDbgSetImportId()}},
            {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
             {static_cast<uint32_t>(OpenCLDebugInfo100DebugOperation)}},
            {SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION,
             {static_cast<uint32_t>(OpenCLDebugInfo100Deref)}},
        }));
  } else {
    uint32_t deref_id = context()->get_constant_mgr()->GetUIntConstId(
        NonSemanticShaderDebugInfo100Deref);

    deref_operation = std::unique_ptr<Instruction>(
        new Instruction(context(), spv::Op::OpExtInst,
                        context()->get_type_mgr()->GetVoidTypeId(), result_id,
                        {
                            {SPV_OPERAND_TYPE_ID, {GetDbgSetImportId()}},
                            {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
                             {static_cast<uint32_t>(
                                 NonSemanticShaderDebugInfo100DebugOperation)}},
                            {SPV_OPERAND_TYPE_ID, {deref_id}},
                        }));
  }

  // Add to the front of |ext_inst_debuginfo_|.
  deref_operation_ =
      context()->module()->ext_inst_debuginfo_begin()->InsertBefore(
          std::move(deref_operation));

  RegisterDbgInst(deref_operation_);
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(deref_operation_);
  return deref_operation_;
}